

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_archive.hpp
# Opt level: O0

result_type __thiscall
pstore::serialize::archive::details::database_writer_policy::put<pstore::uint128>
          (database_writer_policy *this,uint128 *value)

{
  element_type *peVar1;
  address aVar2;
  shared_ptr<pstore::uint128> local_70 [2];
  pair<std::shared_ptr<pstore::uint128>,_pstore::typed_address<pstore::uint128>_> local_50;
  typed_address<pstore::uint128> local_38;
  typed_address<pstore::uint128> addr;
  shared_ptr<pstore::uint128> ptr;
  uint128 *value_local;
  database_writer_policy *this_local;
  
  std::shared_ptr<pstore::uint128>::shared_ptr((shared_ptr<pstore::uint128> *)&addr);
  local_38 = typed_address<pstore::uint128>::null();
  transaction_base::alloc_rw<pstore::uint128,void>(&local_50,this->transaction_,1);
  std::tie<std::shared_ptr<pstore::uint128>,pstore::typed_address<pstore::uint128>>(local_70,&addr);
  std::tuple<std::shared_ptr<pstore::uint128>&,pstore::typed_address<pstore::uint128>&>::operator=
            ((tuple<std::shared_ptr<pstore::uint128>&,pstore::typed_address<pstore::uint128>&> *)
             local_70,&local_50);
  std::pair<std::shared_ptr<pstore::uint128>,_pstore::typed_address<pstore::uint128>_>::~pair
            (&local_50);
  peVar1 = std::__shared_ptr_access<pstore::uint128,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<pstore::uint128,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&addr);
  *(long *)&peVar1->v_ = (long)value->v_;
  *(undefined8 *)((long)&peVar1->v_ + 8) = *(undefined8 *)((long)&value->v_ + 8);
  aVar2 = typed_address<pstore::uint128>::to_address(&local_38);
  std::shared_ptr<pstore::uint128>::~shared_ptr((shared_ptr<pstore::uint128> *)&addr);
  return (result_type)aVar2.a_;
}

Assistant:

auto put (Ty const & value) -> result_type {
                        std::shared_ptr<Ty> ptr;
                        auto addr = typed_address<Ty>::null ();
                        std::tie (ptr, addr) = transaction_.template alloc_rw<Ty> ();
                        *ptr = value;
                        return addr.to_address ();
                    }